

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalidUpdatableModelWrongBiases(void)

{
  pointer pcVar1;
  int iVar2;
  float fVar3;
  WeightParams *pWVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *pWVar10;
  ostream *poVar11;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_50.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x20020;
  iVar2 = (pAVar9->shape_).current_size_;
  if (iVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar9->shape_,iVar2 + 1);
    iVar2 = (pAVar9->shape_).current_size_;
  }
  (pAVar9->shape_).current_size_ = iVar2 + 1;
  ((pAVar9->shape_).rep_)->elements[iVar2] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_50.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x20020;
  local_50.isupdatable_ = true;
  local_50.specificationversion_ = 4;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  this_00->isupdatable_ = true;
  if (this_00->_oneof_case_[0] == 0x8c) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01.innerproduct_);
    (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 1;
  (this_01.innerproduct_)->outputchannels_ = 1;
  pWVar10 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar10;
  }
  fVar3 = (float)(pWVar10->floatvalue_).current_size_;
  if (fVar3 == (float)(pWVar10->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,(int)fVar3 + 1);
    fVar3 = (float)(pWVar10->floatvalue_).current_size_;
    pWVar4 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
    (pWVar10->floatvalue_).current_size_ = (int)fVar3 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[(int)fVar3] = 1.0;
    pWVar10 = pWVar4;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar10;
    }
  }
  else {
    (pWVar10->floatvalue_).current_size_ = (int)fVar3 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[(int)fVar3] = 1.0;
  }
  pWVar10->isupdatable_ = true;
  (this_01.innerproduct_)->hasbias_ = true;
  pWVar10 = (this_01.innerproduct_)->bias_;
  if (pWVar10 == (WeightParams *)0x0) {
    pWVar10 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar10);
    (this_01.innerproduct_)->bias_ = pWVar10;
  }
  iVar2 = (pWVar10->floatvalue_).current_size_;
  if (iVar2 == (pWVar10->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar2 + 1);
    iVar2 = (pWVar10->floatvalue_).current_size_;
    pWVar4 = (this_01.innerproduct_)->bias_;
    (pWVar10->floatvalue_).current_size_ = iVar2 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[iVar2] = 1.0;
    pWVar10 = pWVar4;
    if (pWVar4 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      (this_01.innerproduct_)->bias_ = pWVar10;
    }
  }
  else {
    (pWVar10->floatvalue_).current_size_ = iVar2 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[iVar2] = 1.0;
  }
  pWVar10->isupdatable_ = false;
  CoreML::Model::validate((Result *)local_78,&local_50);
  bVar5 = CoreML::Result::good((Result *)local_78);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar5;
}

Assistant:

int testInvalidUpdatableModelWrongBiases() {

    /*
     checks that updatable peroperty is true for biases if the layer is marked as updatable.
     */

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    m1.set_isupdatable(true);
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("probs");
    innerProductLayer->set_isupdatable(true);

    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);

    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(false);

    Result res = Model::validate(m1);

    ML_ASSERT_BAD(res);
    return 0;
}